

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void ym2610_write(void *chip,UINT8 a,UINT8 v)

{
  byte bVar1;
  uint uVar2;
  FM_OPN *OPN_00;
  undefined7 uVar3;
  int local_30;
  UINT8 statusmask;
  int ch;
  int addr;
  FM_OPN *OPN;
  YM2610 *F2610;
  UINT8 v_local;
  UINT8 a_local;
  void *chip_local;
  
  OPN_00 = (FM_OPN *)((long)chip + 0x208);
  uVar3 = (undefined7)((ulong)OPN_00 >> 8);
  switch(a & 3) {
  case 0:
    *(UINT8 *)((long)chip + 0x22c) = v;
    *(undefined1 *)((long)chip + 0x5108) = 0;
    if (v < 0x10) {
      (**(code **)((long)chip + 0x660))(*(undefined8 *)((long)chip + 0x678),a,v,CONCAT71(uVar3,a));
    }
    break;
  case 1:
    if (*(char *)((long)chip + 0x5108) == '\0') {
      bVar1 = *(byte *)((long)chip + 0x22c);
      uVar2 = (uint)bVar1;
      *(UINT8 *)((long)chip + (long)(int)uVar2 + 8) = v;
      if ((bVar1 & 0xf0) == 0) {
        (**(code **)((long)chip + 0x660))(*(undefined8 *)((long)chip + 0x678),a,v,CONCAT71(uVar3,a))
        ;
      }
      else if ((uVar2 & 0xf0) == 0x10) {
        ym2610_update_req(chip);
        if ((uVar2 - 0x10 < 6) || (uVar2 - 0x19 < 3)) {
          YM_DELTAT_ADPCM_Write((YM_DELTAT *)((long)chip + 0x5368),uVar2 - 0x10,(uint)v);
        }
        else if (uVar2 == 0x1c) {
          bVar1 = v ^ 0xff;
          for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
            *(byte *)((long)chip + (long)local_30 * 0x40 + 0x5121) =
                 bVar1 & (byte)(1 << ((byte)local_30 & 0x1f));
          }
          *(byte *)((long)chip + 0x53f0) = bVar1 & 0x80;
          *(byte *)((long)chip + 0x5360) = *(byte *)((long)chip + 0x5360) & bVar1;
        }
        else {
          emu_logf((DEV_LOGGER *)((long)chip + 0x4760),'\x02',
                   "write to unknown deltat register %02x val=%02x\n",(ulong)uVar2,(ulong)v);
        }
      }
      else if ((uVar2 & 0xf0) == 0x20) {
        ym2610_update_req(chip);
        OPNWriteMode(OPN_00,uVar2,(uint)v);
      }
      else {
        ym2610_update_req(chip);
        OPNWriteReg(OPN_00,uVar2,(uint)v);
      }
    }
    break;
  case 2:
    *(UINT8 *)((long)chip + 0x22c) = v;
    *(undefined1 *)((long)chip + 0x5108) = 1;
    break;
  case 3:
    if (*(char *)((long)chip + 0x5108) == '\x01') {
      ym2610_update_req(chip);
      uVar2 = (uint)*(byte *)((long)chip + 0x22c);
      *(UINT8 *)((long)chip + (long)(int)(uVar2 | 0x100) + 8) = v;
      if (uVar2 < 0x30) {
        FM_ADPCMAWrite((YM2610 *)chip,uVar2,(uint)v);
      }
      else {
        OPNWriteReg(OPN_00,uVar2 | 0x100,(uint)v);
      }
    }
  }
  return;
}

Assistant:

void ym2610_write(void *chip, UINT8 a, UINT8 v)
{
	YM2610 *F2610 = (YM2610 *)chip;
	FM_OPN *OPN   = &F2610->OPN;
	int addr;
	int ch;

	//v &= 0xff;  /* adjust to 8 bit bus */

	switch( a&3 )
	{
	case 0: /* address port 0 */
		OPN->ST.address = v;
		F2610->addr_A1 = 0;

		/* Write register to SSG emulator */
		if( v < 16 ) OPN->ST.SSG_funcs.write(OPN->ST.SSG_param,a,v);
		break;

	case 1: /* data port 0    */
		if (F2610->addr_A1 != 0)
			break;  /* verified on real YM2608 */

		addr = OPN->ST.address;
		F2610->REGS[addr] = v;
		switch(addr & 0xf0)
		{
		case 0x00:  /* SSG section */
			/* Write data to SSG emulator */
			OPN->ST.SSG_funcs.write(OPN->ST.SSG_param,a,v);
			break;
		case 0x10: /* DeltaT ADPCM */
			ym2610_update_req(F2610);

			switch(addr)
			{
			case 0x10:  /* control 1 */
			case 0x11:  /* control 2 */
			case 0x12:  /* start address L */
			case 0x13:  /* start address H */
			case 0x14:  /* stop address L */
			case 0x15:  /* stop address H */

			case 0x19:  /* delta-n L */
			case 0x1a:  /* delta-n H */
			case 0x1b:  /* volume */
				{
					YM_DELTAT_ADPCM_Write(&F2610->deltaT,addr-0x10,v);
				}
				break;

			case 0x1c: /*  FLAG CONTROL : Extend Status Clear/Mask */
				{
					UINT8 statusmask = ~v;
					/* set arrived flag mask */
					for(ch=0;ch<6;ch++)
						F2610->adpcm[ch].flagMask = statusmask&(1<<ch);

					F2610->deltaT.status_change_EOS_bit = statusmask & 0x80;    /* status flag: set bit7 on End Of Sample */

					/* clear arrived flag */
					F2610->adpcm_arrivedEndAddress &= statusmask;
				}
				break;

			default:
				emu_logf(&F2610->OPN.logger, DEVLOG_WARN, "write to unknown deltat register %02x val=%02x\n",addr,v);
				break;
			}

			break;
		case 0x20:  /* Mode Register */
			ym2610_update_req(F2610);
			OPNWriteMode(OPN,addr,v);
			break;
		default:    /* OPN section */
			ym2610_update_req(F2610);
			/* write register */
			OPNWriteReg(OPN,addr,v);
		}
		break;

	case 2: /* address port 1 */
		OPN->ST.address = v;
		F2610->addr_A1 = 1;
		break;

	case 3: /* data port 1    */
		if (F2610->addr_A1 != 1)
			break;  /* verified on real YM2608 */

		ym2610_update_req(F2610);
		addr = OPN->ST.address;
		F2610->REGS[addr | 0x100] = v;
		if( addr < 0x30 )
			/* 100-12f : ADPCM A section */
			FM_ADPCMAWrite(F2610,addr,v);
		else
			OPNWriteReg(OPN,addr | 0x100,v);
	}
	//return OPN->ST.irq;
	return;
}